

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options)

{
  FieldDescriptor **ppFVar1;
  _func_int *p_Var2;
  DescriptorBuilder *this_00;
  FieldDescriptor *pFVar3;
  anon_union_8_8_13f84498_for_Symbol_2 aVar4;
  Message *pMVar5;
  const_iterator intermediate_fields_iter;
  scoped_ptr<google::protobuf::UnknownFieldSet> p;
  bool bVar6;
  int iVar7;
  int iVar8;
  LogMessage *pLVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *pTVar10;
  long *plVar11;
  undefined4 extraout_var_01;
  UnknownFieldSet *pUVar12;
  string *psVar13;
  undefined4 extraout_var_02;
  undefined8 *puVar14;
  size_type *psVar15;
  _func_int **pp_Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_8_8_13f84498_for_Symbol_2 aVar18;
  iterator iVar19;
  anon_union_8_8_13f84498_for_Symbol_2 aVar20;
  UninterpretedOption *pUVar21;
  _func_int *p_Var22;
  Symbol SVar23;
  CodedOutputStream out;
  FieldDescriptor *field;
  string debug_msg_name;
  StringOutputStream outstr;
  scoped_ptr<google::protobuf::UnknownFieldSet> unknown_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  scoped_ptr<google::protobuf::UnknownFieldSet> parent_unknown_fields;
  undefined1 local_170 [32];
  undefined1 local_150 [56];
  anon_union_8_8_13f84498_for_Symbol_2 local_118;
  Message *local_110;
  string local_108;
  StringOutputStream local_e8;
  _func_int *local_d8;
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  const_iterator local_a8;
  iterator iStack_a0;
  FieldDescriptor **local_98;
  scoped_ptr<google::protobuf::UnknownFieldSet> local_90;
  long local_88;
  UnknownFieldSet local_80;
  long lStack_78;
  _func_int **local_70;
  long local_68;
  _func_int *local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar21 = this->uninterpreted_option_;
  iVar7 = (pUVar21->name_).super_RepeatedPtrFieldBase.current_size_;
  local_110 = options;
  if (iVar7 == 0) {
    local_150._0_8_ = local_150 + 0x10;
    local_108._M_dataplus._M_p = (char *)0x18;
    local_150._0_8_ = std::__cxx11::string::_M_create((ulong *)local_150,(ulong)&local_108);
    local_150._16_8_ = local_108._M_dataplus._M_p;
    builtin_strncpy((char *)local_150._0_8_,"Option must have a name.",0x18);
    local_150._8_8_ = local_108._M_dataplus._M_p;
    *(char *)(local_150._0_8_ + (long)local_108._M_dataplus._M_p) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
LAB_002e9978:
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
    }
    return false;
  }
  if (iVar7 < 1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_150,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar9 = internal::LogMessage::operator<<
                       ((LogMessage *)local_150,"CHECK failed: (index) < (current_size_): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar9);
    internal::LogMessage::~LogMessage((LogMessage *)local_150);
  }
  iVar7 = std::__cxx11::string::compare
                    (*(char **)((long)((pUVar21->name_).super_RepeatedPtrFieldBase.rep_)->elements
                                      [0] + 0x18));
  pMVar5 = local_110;
  if (iVar7 == 0) {
    local_150._0_8_ = local_150 + 0x10;
    local_108._M_dataplus._M_p = (char *)0x39;
    local_150._0_8_ = std::__cxx11::string::_M_create((ulong *)local_150,(ulong)&local_108);
    local_150._16_8_ = local_108._M_dataplus._M_p;
    builtin_strncpy((char *)local_150._0_8_,
                    "Option must not use reserved name \"uninterpreted_option\".",0x39);
    local_150._8_8_ = local_108._M_dataplus._M_p;
    *(char *)(local_150._0_8_ + (long)local_108._M_dataplus._M_p) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
    goto LAB_002e9978;
  }
  this_00 = this->builder_;
  iVar7 = (*(local_110->super_MessageLite)._vptr_MessageLite[0x17])(local_110);
  SVar23 = FindSymbolNotEnforcingDepsHelper
                     (this_00,this_00->pool_,*(string **)(CONCAT44(extraout_var,iVar7) + 8),true);
  aVar18 = SVar23.field_1;
  if (SVar23.type != MESSAGE) {
    aVar18._0_4_ = (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x17])(pMVar5);
    aVar18._4_4_ = extraout_var_00;
  }
  if ((DescriptorBuilder *)aVar18.descriptor == (DescriptorBuilder *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_150,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1797);
    pLVar9 = internal::LogMessage::operator<<
                       ((LogMessage *)local_150,"CHECK failed: options_descriptor: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar9);
    internal::LogMessage::~LogMessage((LogMessage *)local_150);
  }
  iVar7 = 0;
  local_118.descriptor = (Descriptor *)0x0;
  local_98 = (FieldDescriptor **)0x0;
  local_a8._M_current = (FieldDescriptor **)0x0;
  iStack_a0._M_current = (FieldDescriptor **)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  pUVar21 = this->uninterpreted_option_;
  do {
    pTVar10 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                        (&(pUVar21->name_).super_RepeatedPtrFieldBase,iVar7);
    psVar13 = (pTVar10->name_part_).ptr_;
    if (local_108._M_string_length != 0) {
      std::__cxx11::string::append((char *)&local_108);
    }
    pTVar10 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                        (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,iVar7);
    if (pTVar10->is_extension_ == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     "(",psVar13);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_170);
      local_150._0_8_ = local_150 + 0x10;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar15) {
        local_150._16_8_ = *psVar15;
        local_150._24_8_ = plVar11[3];
      }
      else {
        local_150._16_8_ = *psVar15;
        local_150._0_8_ = (size_type *)*plVar11;
      }
      local_150._8_8_ = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_108,local_150._0_8_);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      aVar20 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
      SVar23 = LookupSymbol((DescriptorBuilder *)aVar20.descriptor,psVar13,
                            &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                            true);
      if (SVar23.type == FIELD) {
        local_118 = SVar23.field_1;
      }
    }
    else {
      std::__cxx11::string::_M_append((char *)&local_108,(ulong)(psVar13->_M_dataplus)._M_p);
      aVar20 = aVar18;
      local_118.field_descriptor = Descriptor::FindFieldByName(aVar18.descriptor,psVar13);
    }
    aVar4 = local_118;
    if (local_118.descriptor == (Descriptor *)0x0) {
      if (this->builder_->pool_->allow_unknown_ == true) {
LAB_002e9f4e:
        bVar6 = true;
        AddWithoutInterpreting
                  ((OptionInterpreter *)aVar20.descriptor,this->uninterpreted_option_,local_110);
        goto LAB_002ea6b8;
      }
      if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"Option \"",&local_108);
        plVar11 = (long *)std::__cxx11::string::append(local_170);
        psVar15 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar15) {
          local_150._16_8_ = *psVar15;
          local_150._24_8_ = plVar11[3];
          local_150._0_8_ = local_150 + 0x10;
        }
        else {
          local_150._16_8_ = *psVar15;
          local_150._0_8_ = (size_type *)*plVar11;
        }
        local_150._8_8_ = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
        goto LAB_002ea688;
      }
      std::operator+(&local_50,"Option \"",&local_108);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
      pUVar12 = (UnknownFieldSet *)(plVar11 + 2);
      if ((UnknownFieldSet *)*plVar11 == pUVar12) {
        local_80.fields_ = pUVar12->fields_;
        lStack_78 = plVar11[3];
        local_90.ptr_ = &local_80;
      }
      else {
        local_80.fields_ = pUVar12->fields_;
        local_90.ptr_ = (UnknownFieldSet *)*plVar11;
      }
      local_88 = plVar11[1];
      *plVar11 = (long)pUVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_90,
                           (ulong)(this->builder_->undefine_resolved_name_)._M_dataplus._M_p);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar17) {
        local_c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_c8.field_2._8_8_ = puVar14[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_c8._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_c8._M_string_length = puVar14[1];
      *puVar14 = paVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_c8);
      pp_Var16 = (_func_int **)(plVar11 + 2);
      if ((_func_int **)*plVar11 == pp_Var16) {
        local_d8 = *pp_Var16;
        lStack_d0 = plVar11[3];
        local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_d8;
      }
      else {
        local_d8 = *pp_Var16;
        local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)*plVar11;
      }
      local_e8.target_ = (string *)plVar11[1];
      *plVar11 = (long)pp_Var16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_108);
      p_Var2 = (_func_int *)((long)&((local_e8.target_)->_M_dataplus)._M_p + local_68);
      p_Var22 = (_func_int *)0xf;
      if (local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_d8) {
        p_Var22 = local_d8;
      }
      if (p_Var22 < p_Var2) {
        p_Var22 = (_func_int *)0xf;
        if (local_70 != local_60) {
          p_Var22 = local_60[0];
        }
        if (p_Var22 < p_Var2) goto LAB_002ea423;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_70,0,(char *)0x0,
                             (ulong)local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream);
      }
      else {
LAB_002ea423:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_70);
      }
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar17) {
        local_170._16_8_ = paVar17->_M_allocated_capacity;
        local_170._24_8_ = puVar14[3];
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_170 + 0x10);
      }
      else {
        local_170._16_8_ = paVar17->_M_allocated_capacity;
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar14;
      }
      local_170._8_8_ = puVar14[1];
      *puVar14 = paVar17;
      puVar14[1] = 0;
      paVar17->_M_local_buf[0] = '\0';
      plVar11 = (long *)std::__cxx11::string::append(local_170);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar15) {
        local_150._16_8_ = *psVar15;
        local_150._24_8_ = plVar11[3];
        local_150._0_8_ = local_150 + 0x10;
      }
      else {
        local_150._16_8_ = *psVar15;
        local_150._0_8_ = (size_type *)*plVar11;
      }
      local_150._8_8_ = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      if (local_70 != local_60) {
        operator_delete(local_70,(ulong)(local_60[0] + 1));
      }
      if (local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_d8) {
        operator_delete(local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                        (ulong)(local_d8 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        (ulong)(local_c8.field_2._M_allocated_capacity + 1));
      }
      if (local_90.ptr_ != &local_80) {
        operator_delete(local_90.ptr_,
                        (ulong)((long)&((local_80.fields_)->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002ea6ae:
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)((long)&(((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          *)local_50.field_2._M_allocated_capacity)->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      goto LAB_002ea6b6;
    }
    if (*(DescriptorBuilder **)(local_118.descriptor + 0x58) !=
        (DescriptorBuilder *)aVar18.descriptor) {
      if (*(char *)&((*(DescriptorBuilder **)(local_118.descriptor + 0x58))->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != '\0') goto LAB_002e9f4e;
      std::operator+(&local_c8,"Option field \"",&local_108);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_c8);
      pp_Var16 = (_func_int **)(plVar11 + 2);
      if ((_func_int **)*plVar11 == pp_Var16) {
        local_d8 = *pp_Var16;
        lStack_d0 = plVar11[3];
        local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = &local_d8;
      }
      else {
        local_d8 = *pp_Var16;
        local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream = (_func_int **)*plVar11;
      }
      local_e8.target_ = (string *)plVar11[1];
      *plVar11 = (long)pp_Var16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_e8,**(ulong **)aVar18.descriptor);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 == paVar17) {
        local_170._16_8_ = paVar17->_M_allocated_capacity;
        local_170._24_8_ = puVar14[3];
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_170 + 0x10);
      }
      else {
        local_170._16_8_ = paVar17->_M_allocated_capacity;
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar14;
      }
      local_170._8_8_ = puVar14[1];
      *puVar14 = paVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_170);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar15) {
        local_150._16_8_ = *psVar15;
        local_150._24_8_ = plVar11[3];
        local_150._0_8_ = local_150 + 0x10;
      }
      else {
        local_150._16_8_ = *psVar15;
        local_150._0_8_ = (size_type *)*plVar11;
      }
      local_150._8_8_ = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      if (local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream != &local_d8) {
        operator_delete(local_e8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream,
                        (ulong)(local_d8 + 1));
      }
      local_50.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_002ea6ae;
      goto LAB_002ea6b6;
    }
    pUVar21 = this->uninterpreted_option_;
    iVar8 = (pUVar21->name_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar7 < iVar8 + -1) {
      if (*(GoogleOnceDynamic **)(local_118.descriptor + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(local_118.descriptor + 0x40),
                   FieldDescriptor::TypeOnceInit,local_118.field_descriptor);
      }
      if ((*(uint *)(aVar4.descriptor + 0x48) & 0xfffffffe) == 10) {
        if (*(int *)(local_118.descriptor + 0x4c) != 3) {
          if (iStack_a0._M_current == local_98) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_a8,iStack_a0,&local_118.field_descriptor);
          }
          else {
            *iStack_a0._M_current = (FieldDescriptor *)local_118;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          aVar18 = local_118;
          if (*(GoogleOnceDynamic **)(local_118.descriptor + 0x40) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (*(GoogleOnceDynamic **)(local_118.descriptor + 0x40),
                       FieldDescriptor::TypeOnceInit,local_118.field_descriptor);
          }
          aVar18 = (anon_union_8_8_13f84498_for_Symbol_2)
                   ((anon_union_8_8_13f84498_for_Symbol_2 *)(aVar18.descriptor + 0x70))->descriptor;
          pUVar21 = this->uninterpreted_option_;
          iVar8 = (pUVar21->name_).super_RepeatedPtrFieldBase.current_size_;
          goto LAB_002e9c2a;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"Option field \"",&local_108);
        plVar11 = (long *)std::__cxx11::string::append(local_170);
        local_150._0_8_ = local_150 + 0x10;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar15) {
          local_150._16_8_ = *psVar15;
          local_150._24_8_ = plVar11[3];
        }
        else {
          local_150._16_8_ = *psVar15;
          local_150._0_8_ = (size_type *)*plVar11;
        }
        local_150._8_8_ = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"Option \"",&local_108);
        plVar11 = (long *)std::__cxx11::string::append(local_170);
        local_150._0_8_ = local_150 + 0x10;
        psVar15 = (size_type *)(plVar11 + 2);
        if ((size_type *)*plVar11 == psVar15) {
          local_150._16_8_ = *psVar15;
          local_150._24_8_ = plVar11[3];
        }
        else {
          local_150._16_8_ = *psVar15;
          local_150._0_8_ = (size_type *)*plVar11;
        }
        local_150._8_8_ = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_150);
      }
LAB_002ea688:
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
      local_50.field_2._M_allocated_capacity = local_170._16_8_;
      local_50._M_dataplus._M_p = (pointer)local_170._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_170 + 0x10)) goto LAB_002ea6ae;
      goto LAB_002ea6b6;
    }
LAB_002e9c2a:
    iVar19._M_current = iStack_a0._M_current;
    intermediate_fields_iter._M_current = local_a8._M_current;
    aVar20 = local_118;
    iVar7 = iVar7 + 1;
  } while (iVar7 < iVar8);
  if (*(int *)(local_118.descriptor + 0x4c) != 3) {
    iVar7 = (*(local_110->super_MessageLite)._vptr_MessageLite[0x16])();
    pUVar12 = (UnknownFieldSet *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x10))
                        ((long *)CONCAT44(extraout_var_01,iVar7),local_110);
    bVar6 = ExamineIfOptionIsSet
                      (this,intermediate_fields_iter,(const_iterator)iVar19._M_current,
                       aVar20.field_descriptor,&local_108,pUVar12);
    if (!bVar6) {
LAB_002ea6b6:
      bVar6 = false;
      goto LAB_002ea6b8;
    }
  }
  local_c8._M_dataplus._M_p = (pointer)operator_new(8);
  *(vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> **)
   local_c8._M_dataplus._M_p =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  bVar6 = SetOptionValue(this,local_118.field_descriptor,
                         (UnknownFieldSet *)local_c8._M_dataplus._M_p);
  if (bVar6) {
    if (iStack_a0._M_current != local_a8._M_current) {
      iVar19._M_current = iStack_a0._M_current;
      do {
        local_90.ptr_ = (UnknownFieldSet *)operator_new(8);
        (local_90.ptr_)->fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)0x0;
        pFVar3 = iVar19._M_current[-1];
        if (*(GoogleOnceDynamic **)(pFVar3 + 0x40) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(pFVar3 + 0x40),FieldDescriptor::TypeOnceInit,pFVar3);
        }
        ppFVar1 = iVar19._M_current + -1;
        if (*(int *)(pFVar3 + 0x48) == 10) {
          if (local_90.ptr_ == (UnknownFieldSet *)0x0) {
LAB_002ea72a:
            __assert_fail("ptr_ != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                          ,0x5f,
                          "C *google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator->() const [C = google::protobuf::UnknownFieldSet]"
                         );
          }
          pUVar12 = UnknownFieldSet::AddGroup(local_90.ptr_,*(int *)(*ppFVar1 + 0x38));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_002ea70b;
          UnknownFieldSet::MergeFrom(pUVar12,(UnknownFieldSet *)local_c8._M_dataplus._M_p);
        }
        else {
          if (*(int *)(pFVar3 + 0x48) != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_150,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1825);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_150,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pFVar3 = iVar19._M_current[-1];
            if (*(GoogleOnceDynamic **)(pFVar3 + 0x40) != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (*(GoogleOnceDynamic **)(pFVar3 + 0x40),FieldDescriptor::TypeOnceInit,pFVar3
                        );
            }
            pLVar9 = internal::LogMessage::operator<<(pLVar9,*(int *)(pFVar3 + 0x48));
            internal::LogFinisher::operator=((LogFinisher *)local_170,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_150);
            internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_90);
            goto LAB_002ea63b;
          }
          if (local_90.ptr_ == (UnknownFieldSet *)0x0) goto LAB_002ea72a;
          psVar13 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                              (local_90.ptr_,*(int *)(*ppFVar1 + 0x38));
          io::StringOutputStream::StringOutputStream(&local_e8,psVar13);
          io::CodedOutputStream::CodedOutputStream
                    ((CodedOutputStream *)local_170,&local_e8.super_ZeroCopyOutputStream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_002ea70b;
          internal::WireFormat::SerializeUnknownFields
                    ((UnknownFieldSet *)local_c8._M_dataplus._M_p,(CodedOutputStream *)local_170);
          if (local_170[0x18] == '\x01') {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_150,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1818);
            pLVar9 = internal::LogMessage::operator<<
                               ((LogMessage *)local_150,"CHECK failed: !out.HadError(): ");
            pLVar9 = internal::LogMessage::operator<<
                               (pLVar9,"Unexpected failure while serializing option submessage ");
            pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_108);
            pLVar9 = internal::LogMessage::operator<<(pLVar9,"\".");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
            internal::LogMessage::~LogMessage((LogMessage *)local_150);
          }
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_170);
          io::StringOutputStream::~StringOutputStream(&local_e8);
        }
        p.ptr_ = local_90.ptr_;
        local_90.ptr_ = (UnknownFieldSet *)0x0;
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
                  ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_c8,p.ptr_);
        internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr(&local_90);
        iVar19._M_current = ppFVar1;
      } while (ppFVar1 != local_a8._M_current);
    }
    pMVar5 = local_110;
    iVar7 = (*(local_110->super_MessageLite)._vptr_MessageLite[0x16])(local_110);
    pUVar12 = (UnknownFieldSet *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x18))
                        ((long *)CONCAT44(extraout_var_02,iVar7),pMVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_002ea70b:
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5b,
                    "C &google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::operator*() const [C = google::protobuf::UnknownFieldSet]"
                   );
    }
    bVar6 = true;
    UnknownFieldSet::MergeFrom(pUVar12,(UnknownFieldSet *)local_c8._M_dataplus._M_p);
  }
  else {
LAB_002ea63b:
    bVar6 = false;
  }
  internal::scoped_ptr<google::protobuf::UnknownFieldSet>::~scoped_ptr
            ((scoped_ptr<google::protobuf::UnknownFieldSet> *)&local_c8);
LAB_002ea6b8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8._M_current == (FieldDescriptor **)0x0) {
    return bVar6;
  }
  operator_delete(local_a8._M_current,(long)local_98 - (long)local_a8._M_current);
  return bVar6;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError("Option must not use reserved name "
                        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = NULL;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the
  // file we're currently building. The descriptor should be there as long as
  // the file we're building imported "google/protobuf/descriptors.proto".

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
    options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = NULL;
  std::vector<const FieldDescriptor*> intermediate_fields;
  string debug_msg_name = "";

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol = builder_->LookupSymbol(name_part,
                                      options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == NULL) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError("Option \"" + debug_msg_name + "\" unknown.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else if (i < uninterpreted_option_->name_size() - 1) {
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        return AddNameError("Option \"" +  debug_msg_name +
                            "\" is an atomic type, not a message.");
      } else if (field->is_repeated()) {
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is a repeated message. Repeated message "
                            "options must be initialized using an "
                            "aggregate value.");
      } else {
        // Drill down into the submessage.
        intermediate_fields.push_back(field);
        descriptor = field->message_type();
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() && !ExamineIfOptionIsSet(
          intermediate_fields.begin(),
          intermediate_fields.end(),
          field, debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }


  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  google::protobuf::scoped_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    google::protobuf::scoped_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
         parent_unknown_fields->AddGroup((*iter)->number())
                              ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  return true;
}